

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::save_image(PathTracer *this,string *fname)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  FILE *__stream;
  reference pvVar4;
  ulong uVar5;
  uchar *in;
  undefined8 uVar6;
  ulong local_40;
  size_t i;
  uint32_t *frame_out;
  size_t h;
  size_t w;
  uint32_t *frame;
  string *fname_local;
  PathTracer *this_local;
  
  if (this->state == DONE) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->frameBuffer).data,0);
    sVar1 = (this->frameBuffer).w;
    uVar2 = (this->frameBuffer).h;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar1 * uVar2;
    uVar5 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    in = (uchar *)operator_new__(uVar5);
    for (local_40 = 0; __stream = _stderr, local_40 < uVar2; local_40 = local_40 + 1) {
      memcpy(in + local_40 * sVar1 * 4,pvVar4 + ((uVar2 - local_40) + -1) * sVar1,sVar1 << 2);
    }
    uVar6 = std::__cxx11::string::c_str();
    fprintf(__stream,"[PathTracer] Saving to file: %s... ",uVar6);
    lodepng::encode(fname,in,(uint)sVar1,(uint)uVar2,LCT_RGBA,8);
    fprintf(_stderr,"Done!\n");
  }
  return;
}

Assistant:

void PathTracer::save_image(string fname) {

    if (state != DONE) return;

    uint32_t* frame = &frameBuffer.data[0];
    size_t w = frameBuffer.w;
    size_t h = frameBuffer.h;
    uint32_t* frame_out = new uint32_t[w * h];
    for(size_t i = 0; i < h; ++i) {
      memcpy(frame_out + i * w, frame + (h - i - 1) * w, 4 * w);
    }

    fprintf(stderr, "[PathTracer] Saving to file: %s... ", fname.c_str());
    lodepng::encode(fname, (unsigned char*) frame_out, w, h);
    fprintf(stderr, "Done!\n");
  }